

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

TextField * __thiscall TextField::writeXml_abi_cxx11_(TextField *this,int indent)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [32];
  undefined1 local_470 [40];
  string local_448 [32];
  Color local_428 [2];
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  undefined1 local_288 [40];
  string local_260 [32];
  Color local_240 [2];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  TextField *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar3 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar3,"<TextField");
  std::__cxx11::string::~string((string *)local_1c8);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar3 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"Text",&local_1f9);
  std::__cxx11::string::string(local_220,(string *)&this_00[1].y);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,iVar1,(string *)local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  uVar2 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"TextColor",(allocator *)(local_288 + 0x27));
  Color::writeXml(local_240,indent + 0x128,(string *)(ulong)uVar2);
  std::operator<<(local_198,(string *)local_240);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)(local_288 + 0x27));
  uVar2 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"TextFontData",&local_2a9);
  FontData::writeXml((FontData *)local_288,indent + 0x168,(string *)(ulong)uVar2);
  std::operator<<(local_198,(string *)local_288);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"InputMode",&local_2d1);
  Util::writeXmlElement<int>
            ((stringstream *)local_1a8,iVar1,(string *)local_2d0,
             *(int *)((long)&this_00[1]._vptr_Widget + 4));
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"PasswordMode",&local_2f9);
  Util::writeXmlElement<bool>
            ((stringstream *)local_1a8,iVar1,(string *)local_2f8,
             (bool)(*(byte *)&this_00[1]._vptr_Widget & 1));
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"AcceptsReturn",&local_321);
  Util::writeXmlElement<bool>
            ((stringstream *)local_1a8,iVar1,(string *)local_320,
             (bool)(*(byte *)((long)&this_00[1]._vptr_Widget + 1) & 1));
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"ImeWindowTitle",&local_349);
  std::__cxx11::string::string(local_370,(string *)&this_00[1].children);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,iVar1,(string *)local_348,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"ImeEnterLabel",&local_391);
  Util::writeXmlElement<int>
            ((stringstream *)local_1a8,iVar1,(string *)local_390,*(int *)&this_00[1].field_0xc);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"ImeWindowMode",&local_3b9);
  Util::writeXmlElement<int>
            ((stringstream *)local_1a8,iVar1,(string *)local_3b8,this_00[1].numChildren);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"Placeholder",&local_3e1);
  std::__cxx11::string::string(local_408,(string *)&this_00[1].field_0x50);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,iVar1,(string *)local_3e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  uVar2 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"PlaceHolderColor",(allocator *)(local_470 + 0x27));
  Color::writeXml(local_428,indent + 0x118,(string *)(ulong)uVar2);
  std::operator<<(local_198,(string *)local_428);
  std::__cxx11::string::~string((string *)local_428);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)(local_470 + 0x27));
  uVar2 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"PlaceholderFont",&local_491);
  FontData::writeXml((FontData *)local_470,indent + 0x138,(string *)(ulong)uVar2);
  std::operator<<(local_198,(string *)local_470);
  std::__cxx11::string::~string((string *)local_470);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"TextTrimming",&local_4b9);
  Util::writeXmlElement<TextTrimming>
            ((stringstream *)local_1a8,iVar1,(string *)local_4b8,
             *(TextTrimming *)&this_00[2].field_0x50);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"LineBreak",&local_4e1);
  Util::writeXmlElement<LineBreak>
            ((stringstream *)local_1a8,iVar1,(string *)local_4e0,
             *(LineBreak *)&this_00[2].field_0x54);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"HorizontalAlignment",&local_509);
  Util::writeXmlElement<HorizontalAlignment>
            ((stringstream *)local_1a8,iVar1,(string *)local_508,
             *(HorizontalAlignment *)&this_00[2].field_0x48);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"VerticalAlignment",&local_531);
  Util::writeXmlElement<VerticalAlignment>
            ((stringstream *)local_1a8,iVar1,(string *)local_530,
             *(VerticalAlignment *)&this_00[2].field_0x4c);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  Util::getIndent_abi_cxx11_(local_558,local_1c);
  poVar3 = std::operator<<(local_198,(string *)local_558);
  std::operator<<(poVar3,"</TextField>");
  std::__cxx11::string::~string((string *)local_558);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string TextField::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<TextField";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "Text", text);
	str << textColor.writeXml(indent + 1, "TextColor");
	str << textFont.writeXml(indent + 1, "TextFontData");
	Util::writeXmlElement(str, indent + 1, "InputMode", textInputMode);
	Util::writeXmlElement(str, indent + 1, "PasswordMode", passwordMode);
	Util::writeXmlElement(str, indent + 1, "AcceptsReturn", acceptsReturn);
	Util::writeXmlElement(str, indent + 1, "ImeWindowTitle", imeWindowTitle);
	Util::writeXmlElement(str, indent + 1, "ImeEnterLabel", imeEnterLabel);
	Util::writeXmlElement(str, indent + 1, "ImeWindowMode", imeWindowMode);
	Util::writeXmlElement(str, indent + 1, "Placeholder", placeholder);
	str << placeHolderColor.writeXml(indent + 1, "PlaceHolderColor");
	str << placeholderFont.writeXml(indent + 1, "PlaceholderFont");
	Util::writeXmlElement(str, indent + 1, "TextTrimming", textTrimming);
	Util::writeXmlElement(str, indent + 1, "LineBreak", lineBreak);
	Util::writeXmlElement(str, indent + 1, "HorizontalAlignment", horizontalAlignment);
	Util::writeXmlElement(str, indent + 1, "VerticalAlignment", verticalAlignment);

	str << Util::getIndent(indent) << "</TextField>";

	return str.str();
}